

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reciprocal.c
# Opt level: O3

uint64_t randomx_reciprocal(uint64_t divisor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  uint64_t uVar4;
  int iVar5;
  ulong uVar6;
  uint64_t uVar7;
  bool bVar8;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = divisor;
  auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000);
  uVar4 = SUB168(auVar2 / auVar1,0);
  uVar6 = SUB168(auVar2 % auVar1,0);
  iVar5 = 0;
  uVar7 = divisor;
  do {
    iVar5 = iVar5 + 1;
    bVar8 = 1 < uVar7;
    uVar7 = uVar7 >> 1;
  } while (bVar8);
  do {
    uVar3 = uVar6 * 2;
    bVar8 = divisor - uVar6 <= uVar6;
    uVar4 = (ulong)bVar8 + uVar4 * 2;
    uVar6 = uVar3 - divisor;
    if (!bVar8) {
      uVar6 = uVar3;
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return uVar4;
}

Assistant:

uint64_t randomx_reciprocal(uint64_t divisor) {

	assert(divisor != 0);

	const uint64_t p2exp63 = 1ULL << 63;

	uint64_t quotient = p2exp63 / divisor, remainder = p2exp63 % divisor;

	unsigned bsr = 0; //highest set bit in divisor

	for (uint64_t bit = divisor; bit > 0; bit >>= 1)
		bsr++;

	for (unsigned shift = 0; shift < bsr; shift++) {
		if (remainder >= divisor - remainder) {
			quotient = quotient * 2 + 1;
			remainder = remainder * 2 - divisor;
		}
		else {
			quotient = quotient * 2;
			remainder = remainder * 2;
		}
	}

	return quotient;
}